

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_asn1_bool(CBS *cbs,int *out)

{
  uint8_t uVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  undefined1 local_30 [7];
  uint8_t value;
  CBS bytes;
  int *out_local;
  CBS *cbs_local;
  
  bytes.len = (size_t)out;
  iVar2 = CBS_get_asn1(cbs,(CBS *)local_30,1);
  if ((iVar2 == 0) || (sVar3 = CBS_len((CBS *)local_30), sVar3 != 1)) {
    return 0;
  }
  puVar4 = CBS_data((CBS *)local_30);
  uVar1 = *puVar4;
  if ((uVar1 != '\0') && (uVar1 != 0xff)) {
    return 0;
  }
  *(uint *)bytes.len = (uint)(uVar1 != '\0');
  return 1;
}

Assistant:

int CBS_get_asn1_bool(CBS *cbs, int *out) {
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, CBS_ASN1_BOOLEAN) || CBS_len(&bytes) != 1) {
    return 0;
  }

  const uint8_t value = *CBS_data(&bytes);
  if (value != 0 && value != 0xff) {
    return 0;
  }

  *out = !!value;
  return 1;
}